

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall Chainstate::ForceFlushStateToDisk(Chainstate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  BlockValidationState state;
  char *in_stack_ffffffffffffff70;
  _Alloc_hider in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ValidationState<BlockValidationResult> local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_68.m_reject_reason.field_2;
  local_68.m_mode = M_VALID;
  local_68.m_result = BLOCK_RESULT_UNSET;
  local_68.m_reject_reason._M_string_length = 0;
  local_68.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_68.m_debug_message.field_2;
  local_68.m_debug_message._M_string_length = 0;
  local_68.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_68.m_reject_reason._M_dataplus._M_p = (pointer)paVar1;
  local_68.m_debug_message._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = FlushStateToDisk(this,(BlockValidationState *)&local_68,ALWAYS,0);
  if (!bVar3) {
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              ((string *)&stack0xffffffffffffff78,&local_68);
    logging_function._M_str = "ForceFlushStateToDisk";
    logging_function._M_len = 0x15;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<char[22],std::__cxx11::string>
              (logging_function,source_file,0xb76,
               IPC|COINDB|PROXY|RAND|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ZMQ|MEMPOOL|NET,
               (Level)(string *)&stack0xffffffffffffff78,in_stack_ffffffffffffff70,
               (char (*) [22])in_stack_ffffffffffffff78._M_p,in_stack_ffffffffffffff80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff78._M_p != &local_78) {
      operator_delete(in_stack_ffffffffffffff78._M_p,local_78._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_debug_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.m_debug_message._M_dataplus._M_p,
                    CONCAT71(local_68.m_debug_message.field_2._M_allocated_capacity._1_7_,
                             local_68.m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_reject_reason._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_reject_reason._M_dataplus._M_p,
                    CONCAT71(local_68.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             local_68.m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::ForceFlushStateToDisk()
{
    BlockValidationState state;
    if (!this->FlushStateToDisk(state, FlushStateMode::ALWAYS)) {
        LogPrintf("%s: failed to flush state (%s)\n", __func__, state.ToString());
    }
}